

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float32_primitive_printString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  int iVar1;
  sysbvm_float32_t sVar2;
  int stringSize;
  sysbvm_float32_t value;
  char buffer [32];
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  memset(&stringSize,0,0x20);
  sVar2 = sysbvm_tuple_float32_decode(*arguments);
  iVar1 = snprintf((char *)&stringSize,0x20,"%g",(double)(float)sVar2);
  if (iVar1 < 0) {
    context_local = (sysbvm_context_t *)sysbvm_string_createEmptyWithSize(context,0);
  }
  else {
    context_local =
         (sysbvm_context_t *)sysbvm_string_createWithString(context,(long)iVar1,(char *)&stringSize)
    ;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_printString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    char buffer[32] = {0};
    sysbvm_float32_t value = sysbvm_tuple_float32_decode(arguments[0]);

    int stringSize = snprintf(buffer, sizeof(buffer), "%g", value);
    if(stringSize < 0)
        return sysbvm_string_createEmptyWithSize(context, 0);
    else
        return sysbvm_string_createWithString(context, stringSize, buffer);
}